

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O2

void __thiscall PathTracerThread::viewer_thread_func(PathTracerThread *this)

{
  int iVar1;
  undefined4 extraout_var;
  void *__stat_loc;
  shared_ptr<myvk::CommandBuffer> viewer_command_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> main_command_pool;
  
  spdlog::info<char[32]>((char (*) [32])"Enter path tracer viewer thread");
  iVar1 = (*(((this->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  myvk::CommandPool::Create((CommandPool *)&main_command_pool,&this->m_main_queue,0);
  myvk::Fence::Create((Fence *)&fence,(Ptr<Device> *)CONCAT44(extraout_var,iVar1),0);
  while (((this->m_run)._M_base._M_i & 1U) != 0) {
    myvk::CommandBuffer::Create
              ((CommandBuffer *)&viewer_command_buffer,&main_command_pool,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    myvk::CommandBuffer::Begin
              (viewer_command_buffer.
               super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    PathTracerViewer::CmdGenRenderPass
              ((this->m_path_tracer_viewer_ptr).
               super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &viewer_command_buffer);
    myvk::CommandBuffer::End
              (viewer_command_buffer.
               super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    myvk::Fence::Reset(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    myvk::CommandBuffer::Submit
              (viewer_command_buffer.
               super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&fence);
    __stat_loc = (void *)0xffffffffffffffff;
    myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      0xffffffffffffffff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&viewer_command_buffer.
                super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    spdlog::debug<char[24]>((char (*) [24])"m_viewer_semaphore wait");
    binary_semaphore::wait(&this->m_viewer_semaphore,__stat_loc);
  }
  spdlog::info<char[31]>((char (*) [31])"Quit path tracer viewer thread");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&main_command_pool.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void PathTracerThread::viewer_thread_func() {
	spdlog::info("Enter path tracer viewer thread");

	const std::shared_ptr<myvk::Device> &device = m_main_queue->GetDevicePtr();
	const std::shared_ptr<PathTracer> &path_tracer = m_path_tracer_viewer_ptr->GetPathTracerPtr();

	std::shared_ptr<myvk::CommandPool> main_command_pool = myvk::CommandPool::Create(m_main_queue);

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	while (m_run.load(std::memory_order_acquire)) {
		{
			std::shared_ptr<myvk::CommandBuffer> viewer_command_buffer = myvk::CommandBuffer::Create(main_command_pool);
			viewer_command_buffer->Begin();
			m_path_tracer_viewer_ptr->CmdGenRenderPass(viewer_command_buffer);
			viewer_command_buffer->End();

			fence->Reset();
			viewer_command_buffer->Submit(fence);
			fence->Wait();
		}

		spdlog::debug("m_viewer_semaphore wait");
		m_viewer_semaphore.wait();
	}

	spdlog::info("Quit path tracer viewer thread");
}